

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# player-attack.c
# Opt level: O0

void py_attack(player *p,loc_conflict grid)

{
  _Bool _Var1;
  monster *mon_00;
  byte local_3d;
  int local_3c;
  uint local_38;
  int32_t sp_gain;
  monster *mon;
  int local_20;
  _Bool fear;
  uint uStack_1c;
  _Bool slain;
  wchar_t blow_energy;
  wchar_t avail_energy;
  player *p_local;
  loc_conflict grid_local;
  
  if ((int)(uint)z_info->move_energy < (int)p->energy) {
    local_38 = (uint)z_info->move_energy;
  }
  else {
    local_38 = (uint)p->energy;
  }
  uStack_1c = local_38;
  local_20 = (int)((long)(ulong)((uint)z_info->move_energy * 100) / (long)(p->state).num_blows);
  mon._7_1_ = 0;
  mon._6_1_ = 0;
  _blow_energy = p;
  p_local = (player *)grid;
  mon_00 = square_monster((chunk *)cave,grid);
  disturb(_blow_energy);
  _blow_energy->upkeep->energy_use = L'\0';
  _Var1 = flag_has_dbg((_blow_energy->state).pflags,3,0x11,"p->state.pflags","(PF_COMBAT_REGEN)");
  if (_Var1) {
    if (_blow_energy->msp < 10) {
      local_3c = 10;
    }
    else {
      local_3c = (int)_blow_energy->msp;
    }
    player_adjust_mana_precise(_blow_energy,(local_3c << 0xe) / 5);
  }
  _Var1 = flag_has_dbg((_blow_energy->state).pflags,3,0xf,"p->state.pflags","(PF_SHIELD_BASH)");
  if (((!_Var1) || (_Var1 = monster_is_visible(mon_00), !_Var1)) ||
     (_Var1 = attempt_shield_bash(_blow_energy,mon_00,(_Bool *)((long)&mon + 6)), !_Var1)) {
    while( true ) {
      local_3d = 0;
      if (local_20 <= uStack_1c - _blow_energy->upkeep->energy_use) {
        local_3d = mon._7_1_ ^ 0xff;
      }
      if ((local_3d & 1) == 0) break;
      mon._7_1_ = py_attack_real(_blow_energy,(loc_conflict)p_local,(_Bool *)((long)&mon + 6));
      _blow_energy->upkeep->energy_use = local_20 + _blow_energy->upkeep->energy_use;
    }
    if (((mon._6_1_ & 1) != 0) && (_Var1 = monster_is_visible(mon_00), _Var1)) {
      add_monster_message(mon_00,L'#',true);
    }
  }
  return;
}

Assistant:

void py_attack(struct player *p, struct loc grid)
{
	int avail_energy = MIN(p->energy, z_info->move_energy);
	int blow_energy = 100 * z_info->move_energy / p->state.num_blows;
	bool slain = false, fear = false;
	struct monster *mon = square_monster(cave, grid);

	/* Disturb the player */
	disturb(p);

	/* Initialize the energy used */
	p->upkeep->energy_use = 0;

	/* Reward BGs with 5% of max SPs, min 1/2 point */
	if (player_has(p, PF_COMBAT_REGEN)) {
		int32_t sp_gain = (((int32_t)MAX(p->msp, 10)) * 16384) / 5;
		player_adjust_mana_precise(p, sp_gain);
	}

	/* Player attempts a shield bash if they can, and if monster is visible
	 * and not too pathetic */
	if (player_has(p, PF_SHIELD_BASH) && monster_is_visible(mon)) {
		/* Monster may die */
		if (attempt_shield_bash(p, mon, &fear)) return;
	}

	/* Attack until the next attack would exceed energy available or
	 * a full turn or until the enemy dies. We limit energy use
	 * to avoid giving monsters a possible double move. */
	while (avail_energy - p->upkeep->energy_use >= blow_energy && !slain) {
		slain = py_attack_real(p, grid, &fear);
		p->upkeep->energy_use += blow_energy;
	}

	/* Hack - delay fear messages */
	if (fear && monster_is_visible(mon)) {
		add_monster_message(mon, MON_MSG_FLEE_IN_TERROR, true);
	}
}